

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cw_bwt.h
# Opt level: O2

void __thiscall
bwtil::cw_bwt::cw_bwt
          (cw_bwt *this,string *input_string,cw_bwt_input_type input_type,uint k,bool verbose)

{
  undefined1 auVar1 [16];
  int iVar2;
  uint uVar3;
  ostream *poVar4;
  BackwardFileIterator *this_00;
  undefined4 extraout_var;
  ContextAutomata *ctx;
  undefined1 auVar6 [64];
  undefined1 in_XMM1 [16];
  ContextAutomata local_d0;
  ulong uVar5;
  undefined1 extraout_var_00 [56];
  
  (this->ca).inverse_remapping.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ca).remapping.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ca).remapping.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ca).remapping.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ca).inverse_remapping.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ca).inverse_remapping.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ca).inverse_remapping.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ca).remapping.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ca).prefix_nr.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ca).prefix_nr.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ca).prefix_nr.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ca).edges.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ca).prefix_nr.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ca).edges.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ca).edges.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ca).edges.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->partial_sums).super__Vector_base<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->partial_sums).super__Vector_base<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->partial_sums).super__Vector_base<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->dynStrings).
  super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->dynStrings).
  super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->dynStrings).
  super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->frequencies).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->frequencies).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->dynStrings).
  super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->dynStrings).
  super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->frequencies).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->frequencies).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->frequencies).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->lengths).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->lengths).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->lengths).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->verbose = verbose;
  this->k = k;
  if (k == 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Error: context length must be k>0");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  else {
    if (verbose) {
      poVar4 = std::operator<<((ostream *)&std::cout,"\nContext length is k = ");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    if (input_type == path) {
      this_00 = (BackwardFileIterator *)operator_new(0x60);
      BackwardFileIterator::BackwardFileIterator(this_00,input_string);
    }
    else {
      this_00 = (BackwardFileIterator *)operator_new(0x30);
      BackwardStringIterator::BackwardStringIterator((BackwardStringIterator *)this_00,input_string)
      ;
    }
    this->bwIt = &this_00->super_BackwardIterator;
    iVar2 = (*(this_00->super_BackwardIterator)._vptr_BackwardIterator[6])(this_00);
    uVar5 = CONCAT44(extraout_var,iVar2);
    this->n = uVar5;
    if (k < uVar5) {
      auVar1 = vcvtusi2sd_avx512f(in_XMM1,uVar5);
      auVar6._0_8_ = log2(auVar1._0_8_);
      auVar6._8_56_ = extraout_var_00;
      uVar3 = vcvttsd2usi_avx512f(auVar6._0_16_);
      if (k < uVar3) {
        ContextAutomata::ContextAutomata(&local_d0,k,this->bwIt,verbose);
        ctx = &local_d0;
        ContextAutomata::operator=(&this->ca,&local_d0);
        ContextAutomata::~ContextAutomata(&local_d0);
        init(this,(EVP_PKEY_CTX *)ctx);
        if (this->bwIt != (BackwardIterator *)0x0) {
          (*this->bwIt->_vptr_BackwardIterator[1])();
        }
        return;
      }
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "Error: k is too large. k must be <= log_s(n), where s is the alphabet size."
                              );
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "Error: File length n must be n>k, where k is the context length.");
      std::endl<char,std::char_traits<char>>(poVar4);
    }
  }
  exit(0);
}

Assistant:

cw_bwt(string &input_string, cw_bwt_input_type input_type, uint k, bool verbose=false){

		this->verbose=verbose;
		this->k = k;

		if(k==0){
			cout << "Error: context length must be k>0" << endl;
			exit(0);
		}

		if(verbose) cout << "\nContext length is k = " << k << endl;

		if(input_type==path)
			bwIt = new BackwardFileIterator(input_string);
		else
			bwIt = new BackwardStringIterator(input_string);

		n = bwIt->length();

		if(n<=k){
			cout << "Error: File length n must be n>k, where k is the context length." << endl;
			exit(0);
		}

		uint log_n = log2(n);

		if(k>=log_n){
			cout << "Error: k is too large. k must be <= log_s(n), where s is the alphabet size." << endl;
			exit(0);
		}

		ca = ContextAutomata(k, bwIt, verbose);

		init();

		delete bwIt;

	}